

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2padded_cell.cc
# Opt level: O3

S2Point * __thiscall
S2PaddedCell::GetEntryVertex(S2Point *__return_storage_ptr__,S2PaddedCell *this)

{
  undefined1 auVar1 [16];
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  S2Point local_28;
  
  iVar4 = this->ij_lo_[0];
  iVar3 = this->ij_lo_[1];
  if ((this->orientation_ & 2) != 0) {
    iVar5 = 1 << (0x1eU - (char)this->level_ & 0x1f);
    iVar4 = iVar4 + iVar5;
    iVar3 = iVar3 + iVar5;
  }
  S2::FaceSiTitoXYZ(&local_28,(uint)((this->id_).id_ >> 0x3d),iVar4 * 2,iVar3 * 2);
  dVar2 = SQRT(local_28.c_[1] * local_28.c_[1] + local_28.c_[0] * local_28.c_[0] +
               local_28.c_[2] * local_28.c_[2]);
  dVar2 = (double)(~-(ulong)(dVar2 != 0.0) & (ulong)dVar2 |
                  (ulong)(1.0 / dVar2) & -(ulong)(dVar2 != 0.0));
  auVar1._8_4_ = SUB84(dVar2 * local_28.c_[1],0);
  auVar1._0_8_ = dVar2 * local_28.c_[0];
  auVar1._12_4_ = (int)((ulong)(dVar2 * local_28.c_[1]) >> 0x20);
  *(undefined1 (*) [16])__return_storage_ptr__->c_ = auVar1;
  __return_storage_ptr__->c_[2] = dVar2 * local_28.c_[2];
  return __return_storage_ptr__;
}

Assistant:

S2Point S2PaddedCell::GetEntryVertex() const {
  // The curve enters at the (0,0) vertex unless the axis directions are
  // reversed, in which case it enters at the (1,1) vertex.
  unsigned int i = ij_lo_[0];
  unsigned int j = ij_lo_[1];
  if (orientation_ & kInvertMask) {
    int ij_size = S2CellId::GetSizeIJ(level_);
    i += ij_size;
    j += ij_size;
  }
  return S2::FaceSiTitoXYZ(id_.face(), 2 * i, 2 * j).Normalize();
}